

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::CreateLinkScript
          (cmMakefileTargetGenerator *this,char *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *link_commands,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_commands,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends)

{
  pointer pbVar1;
  cmLocalUnixMakefileGenerator3 *this_00;
  ostream *poVar2;
  string *link_command_1;
  pointer pbVar3;
  string_view source;
  string local_320;
  string linkScriptName;
  string local_2e0;
  string link_command;
  char *name_local;
  cmGeneratedFileStream linkScriptStream;
  
  linkScriptStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream._0_1_ = 0x2f;
  name_local = name;
  cmStrCat<std::__cxx11::string&,char,char_const*&>
            (&linkScriptName,&this->TargetBuildDirectoryFull,(char *)&linkScriptStream,&name_local);
  cmGeneratedFileStream::cmGeneratedFileStream(&linkScriptStream,&linkScriptName,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent(&linkScriptStream,true);
  pbVar1 = (link_commands->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (link_commands->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    if ((pbVar3->_M_string_length != 0) && (*(pbVar3->_M_dataplus)._M_p != ':')) {
      poVar2 = std::operator<<((ostream *)&linkScriptStream,(string *)pbVar3);
      std::operator<<(poVar2,"\n");
    }
  }
  this_00 = this->LocalGenerator;
  cmOutputConverter::MaybeRelativeToCurBinDir
            (&local_320,(cmOutputConverter *)this_00,&linkScriptName);
  source._M_str = local_320._M_dataplus._M_p;
  source._M_len = local_320._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_2e0,(cmOutputConverter *)this_00,source,SHELL,false);
  cmStrCat<char_const(&)[39],std::__cxx11::string,char_const(&)[22]>
            (&link_command,(char (*) [39])"$(CMAKE_COMMAND) -E cmake_link_script ",&local_2e0,
             (char (*) [22])" --verbose=$(VERBOSE)");
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_320);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makefile_commands,
             &link_command);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makefile_depends,
             &linkScriptName);
  std::__cxx11::string::~string((string *)&link_command);
  cmGeneratedFileStream::~cmGeneratedFileStream(&linkScriptStream);
  std::__cxx11::string::~string((string *)&linkScriptName);
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateLinkScript(
  const char* name, std::vector<std::string> const& link_commands,
  std::vector<std::string>& makefile_commands,
  std::vector<std::string>& makefile_depends)
{
  // Create the link script file.
  std::string linkScriptName =
    cmStrCat(this->TargetBuildDirectoryFull, '/', name);
  cmGeneratedFileStream linkScriptStream(linkScriptName);
  linkScriptStream.SetCopyIfDifferent(true);
  for (std::string const& link_command : link_commands) {
    // Do not write out empty commands or commands beginning in the
    // shell no-op ":".
    if (!link_command.empty() && link_command[0] != ':') {
      linkScriptStream << link_command << "\n";
    }
  }

  // Create the makefile command to invoke the link script.
  std::string link_command =
    cmStrCat("$(CMAKE_COMMAND) -E cmake_link_script ",
             this->LocalGenerator->ConvertToOutputFormat(
               this->LocalGenerator->MaybeRelativeToCurBinDir(linkScriptName),
               cmOutputConverter::SHELL),
             " --verbose=$(VERBOSE)");
  makefile_commands.push_back(std::move(link_command));
  makefile_depends.push_back(std::move(linkScriptName));
}